

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__file.cc
# Opt level: O0

void __thiscall xemmai::io::t_file::f_blocking__(t_file *this,bool a_value)

{
  anon_class_16_2_82308ac0 a_do;
  bool local_11;
  t_file *ptStack_10;
  bool a_value_local;
  t_file *this_local;
  
  a_do.a_value = &local_11;
  a_do.this = this;
  local_11 = a_value;
  ptStack_10 = this;
  t_sharable::
  f_owned_or_shared<xemmai::t_shared_lock_with_safe_region,xemmai::io::t_file::f_blocking__(bool)::__0>
            (&this->super_t_sharable,a_do);
  return;
}

Assistant:

void t_file::f_blocking__(bool a_value)
{
	f_owned_or_shared<t_shared_lock_with_safe_region>([&]
	{
		if (v_fd < 0) f_throw(L"already closed."sv);
		int flags = fcntl(v_fd, F_GETFL);
		if (flags == -1) portable::f_throw_system_error();
		if (a_value)
			flags &= ~O_NONBLOCK;
		else
			flags |= O_NONBLOCK;
		if (fcntl(v_fd, F_SETFL, flags) == -1) portable::f_throw_system_error();
	});
}